

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-fight-perm.c
# Opt level: O0

int borg_perma_aux(int what)

{
  int local_c;
  int what_local;
  
  switch(what) {
  case 0:
    local_c = borg_perma_aux_speed();
    break;
  case 1:
    local_c = borg_perma_aux_prot_evil();
    break;
  case 2:
    local_c = borg_perma_aux_bless();
    break;
  case 3:
    local_c = borg_perma_aux_resist();
    break;
  case 4:
    local_c = borg_perma_aux_resist_colluin();
    break;
  case 5:
    local_c = borg_perma_aux_resist_p();
    break;
  case 6:
    local_c = borg_perma_aux_fastcast();
    break;
  case 7:
    local_c = borg_perma_aux_hero();
    break;
  case 8:
    local_c = borg_perma_aux_berserk();
    break;
  case 9:
    local_c = borg_perma_aux_berserk_potion();
    break;
  case 10:
    local_c = borg_perma_aux_smite_evil();
    break;
  case 0xb:
    local_c = borg_perma_aux_venom();
    break;
  case 0xc:
    local_c = borg_perma_aux_regen();
    break;
  case 0xd:
    local_c = 0;
    break;
  case 0xe:
    local_c = borg_perma_aux_see_inv();
    break;
  default:
    local_c = 0;
  }
  return local_c;
}

Assistant:

static int borg_perma_aux(int what)
{

    /* Analyze */
    switch (what) {
    case BP_SPEED: {
        return (borg_perma_aux_speed());
    }

    case BP_PROT_FROM_EVIL: {
        return (borg_perma_aux_prot_evil());
    }
    case BP_RESIST_ALL: {
        return (borg_perma_aux_resist());
    }
    case BP_RESIST_ALL_COLLUIN: {
        return (borg_perma_aux_resist_colluin());
    }
    case BP_RESIST_P: {
        return (borg_perma_aux_resist_p());
    }
    case BP_BLESS: {
        return (borg_perma_aux_bless());
    }
    case BP_FASTCAST: {
        return (borg_perma_aux_fastcast());
    }
    case BP_HERO: {
        return (borg_perma_aux_hero());
    }
    case BP_BERSERK: {
        return (borg_perma_aux_berserk());
    }
    case BP_BERSERK_POTION: {
        return (borg_perma_aux_berserk_potion());
    }
    case BP_SMITE_EVIL: {
        return (borg_perma_aux_smite_evil());
    }
    case BP_VENOM: {
        return (borg_perma_aux_venom());
    }
    case BP_REGEN: {
        return (borg_perma_aux_regen());
    }
    case BP_GLYPH: {
        /* return (borg_perma_aux_glyph()); Tends to use too much mana doing
         * this */
        return 0;
    }
    case BP_SEE_INV: {
        return (borg_perma_aux_see_inv());
    }
    }
    return 0;
}